

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int luaopen_io(lua_State *L)

{
  GCobj *pGVar1;
  
  lj_lib_register(L,(char *)0x0,lj_lib_init_io_method,lj_lib_cf_io_method);
  *L->top = L->top[-1];
  L->top = L->top + 1;
  lua_setfield(L,-10000,"FILE*");
  lj_lib_register(L,"io",lj_lib_init_io,lj_lib_cf_io);
  pGVar1 = io_std_new(L,_stdin,"stdin");
  *(GCobj **)((L->glref).ptr64 + 0x2c8) = pGVar1;
  pGVar1 = io_std_new(L,_stdout,"stdout");
  *(GCobj **)((L->glref).ptr64 + 0x2d0) = pGVar1;
  io_std_new(L,_stderr,"stderr");
  return 1;
}

Assistant:

LUALIB_API int luaopen_io(lua_State *L)
{
  LJ_LIB_REG(L, NULL, io_method);
  copyTV(L, L->top, L->top-1); L->top++;
  lua_setfield(L, LUA_REGISTRYINDEX, LUA_FILEHANDLE);
  LJ_LIB_REG(L, LUA_IOLIBNAME, io);
  setgcref(G(L)->gcroot[GCROOT_IO_INPUT], io_std_new(L, stdin, "stdin"));
  setgcref(G(L)->gcroot[GCROOT_IO_OUTPUT], io_std_new(L, stdout, "stdout"));
  io_std_new(L, stderr, "stderr");
  return 1;
}